

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O2

char read_u32(archive_read *a,uint32_t *pvalue)

{
  wchar_t wVar1;
  uint8_t *in_RAX;
  uchar *p_1;
  bool bVar2;
  uint8_t *p;
  
  p = in_RAX;
  wVar1 = read_ahead(a,4,&p);
  if (wVar1 == L'\0') {
    bVar2 = false;
  }
  else {
    *pvalue = *(uint32_t *)p;
    wVar1 = consume(a,4);
    bVar2 = wVar1 == L'\0';
  }
  return bVar2;
}

Assistant:

static char read_u32(struct archive_read* a, uint32_t* pvalue) {
	const uint8_t* p;
	if(!read_ahead(a, 4, &p))
		return 0;

	*pvalue = archive_le32dec(p);
	return ARCHIVE_OK == consume(a, 4);
}